

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_shader.cpp
# Opt level: O3

void gen_sketch_shade(float *ca,float *cr,float *cl,float *cp,float *l,float *e,float *norm,float p,
                     float x,float y,float radius,float *line_dir,float *c)

{
  bool bVar1;
  bool bVar2;
  int i;
  long lVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  vec2 dot_dir;
  vec3 cnew;
  undefined8 local_88;
  float local_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  float local_60;
  undefined4 local_5c;
  undefined1 local_58 [24];
  undefined8 local_40;
  float local_38;
  
  local_58._0_4_ = y;
  local_78._0_4_ = p;
  local_7c = x;
  gen_lambert_shade(ca,cr,cl,norm,l,c);
  gen_phong_shade(cl,cp,l,e,norm,(int)(float)local_78._0_4_,c);
  rgb_to_grayscale(c,c);
  if (norm[2] <= 0.1) {
    lVar3 = 0;
    do {
      c[lVar3] = c[lVar3] * 0.0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  else {
    local_60 = local_7c;
    local_5c = local_58._0_4_;
    fVar8 = *line_dir + 0.1;
    fVar7 = line_dir[1];
    local_88 = CONCAT44(fVar7,fVar8);
    fVar5 = 0.0;
    pfVar4 = (float *)&local_88;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      fVar5 = fVar5 + *pfVar4 * *pfVar4;
      pfVar4 = (float *)((long)&local_88 + 4);
      bVar1 = false;
    } while (bVar2);
    if (fVar5 < 0.0) {
      _local_78 = ZEXT416((uint)fVar8);
      local_58._0_16_ = ZEXT416((uint)fVar7);
      fVar5 = sqrtf(fVar5);
      fVar8 = (float)local_78._0_4_;
      fVar9 = (float)local_78._4_4_;
      fVar7 = (float)local_58._0_4_;
      fVar10 = (float)local_58._4_4_;
    }
    else {
      fVar5 = SQRT(fVar5);
      fVar9 = 0.0;
      fVar10 = 0.0;
    }
    fVar6 = 0.0;
    fVar5 = 1.0 / fVar5;
    fVar8 = fVar5 * fVar8;
    fVar7 = fVar5 * fVar7;
    local_88 = CONCAT44(fVar7,fVar8);
    local_38 = c[2];
    local_40 = *(undefined8 *)c;
    pfVar4 = (float *)&local_88;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      fVar6 = fVar6 + *pfVar4 * *pfVar4;
      pfVar4 = (float *)((long)&local_88 + 4);
      bVar1 = false;
    } while (bVar2);
    if (fVar6 < 0.0) {
      local_78._4_4_ = fVar7;
      local_78._0_4_ = fVar8;
      fStack_70 = fVar5 * fVar9;
      fStack_6c = fVar5 * fVar10;
      fVar6 = sqrtf(fVar6);
      fVar8 = (float)local_78._0_4_;
      fVar7 = (float)local_78._4_4_;
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    local_88 = CONCAT44(fVar7 * (1.0 / fVar6),fVar8 * (1.0 / fVar6));
    draw_line(line_dir,radius,&local_60,c);
    draw_line((float *)&local_88,radius,&local_60,(float *)&local_40);
    if (((float)local_40 == 0.0) && (!NAN((float)local_40))) {
      lVar3 = 0;
      do {
        c[lVar3] = c[lVar3] * 0.0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
    }
  }
  return;
}

Assistant:

void gen_sketch_shade(const vec3 ca, const vec3 cr, const vec3 cl, const vec3 cp, vec3 l, const vec3 e, const vec3 norm, const float p,
const float x, const float y, const float radius, vec2 line_dir, vec3 c){
    gen_lambert_shade(ca, cr, cl, norm, l, c);
    gen_phong_shade(cl, cp, l, e, norm, p, c);

    //calculate a grayscale output (using luminosity method)
    rgb_to_grayscale(c, c);

    //draw silhouette
    if(norm[2]<=0.1f){
        vec3_scale(c, c, 0.0f);
        return;
    }

    //draw inner sketch with a tilted overline
    vec2 dot_dir = {x, y};
    vec2 new_line = {line_dir[0] + 0.1f, line_dir[1]};
    vec2_norm(new_line, new_line);
    vec3 cnew;
    vec3_scale(cnew, c, 1.0f);
    vec2_norm(new_line, new_line);
    draw_line(line_dir, radius, dot_dir, c);
    draw_line(new_line, radius, dot_dir, cnew);

    //composite
    if(cnew[0]==0.0f) vec3_scale(c, c, 0.0f);
}